

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void dxil_spv::scrub_rov_lock_regions
               (CFGNode *node,bool preserve_first_begin,bool preserve_last_end)

{
  Vector<Operation_*> *this;
  Operation **ppOVar1;
  Operation **ppOVar2;
  const_iterator cVar3;
  Operation **ppOVar4;
  long lVar5;
  const_iterator cVar6;
  Operation **ppOVar7;
  undefined7 in_register_00000031;
  long lVar8;
  bool bVar9;
  
  ppOVar2 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  cVar6._M_current =
       (node->ir).operations.
       super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if ((int)CONCAT71(in_register_00000031,preserve_first_begin) != 0) {
    lVar5 = (long)cVar6._M_current - (long)ppOVar2;
    for (lVar8 = lVar5 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
      if ((*ppOVar2)->op == OpBeginInvocationInterlockEXT) goto LAB_0012a6e4;
      if (ppOVar2[1]->op == OpBeginInvocationInterlockEXT) {
        ppOVar2 = ppOVar2 + 1;
        goto LAB_0012a6e4;
      }
      if (ppOVar2[2]->op == OpBeginInvocationInterlockEXT) {
        ppOVar2 = ppOVar2 + 2;
        goto LAB_0012a6e4;
      }
      if (ppOVar2[3]->op == OpBeginInvocationInterlockEXT) {
        ppOVar2 = ppOVar2 + 3;
        goto LAB_0012a6e4;
      }
      ppOVar2 = ppOVar2 + 4;
      lVar5 = lVar5 + -0x20;
    }
    lVar5 = lVar5 >> 3;
    if (lVar5 == 1) {
LAB_0012a6c5:
      if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
        ppOVar2 = cVar6._M_current;
      }
    }
    else if (lVar5 == 2) {
LAB_0012a6b6:
      if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
        ppOVar2 = ppOVar2 + 1;
        goto LAB_0012a6c5;
      }
    }
    else {
      if (lVar5 != 3) goto LAB_0012a8fd;
      if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
        ppOVar2 = ppOVar2 + 1;
        goto LAB_0012a6b6;
      }
    }
LAB_0012a6e4:
    if (ppOVar2 == cVar6._M_current) {
LAB_0012a8fd:
      __assert_fail("begin_itr != node->ir.operations.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x1cd,"void dxil_spv::scrub_rov_begin_lock(CFGNode *, bool)");
    }
    ppOVar2 = ppOVar2 + 1;
  }
  this = &(node->ir).operations;
  lVar5 = (long)cVar6._M_current - (long)ppOVar2;
  for (lVar8 = lVar5 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
    if ((*ppOVar2)->op == OpBeginInvocationInterlockEXT) goto LAB_0012a79e;
    if (ppOVar2[1]->op == OpBeginInvocationInterlockEXT) {
      ppOVar2 = ppOVar2 + 1;
      goto LAB_0012a79e;
    }
    if (ppOVar2[2]->op == OpBeginInvocationInterlockEXT) {
      ppOVar2 = ppOVar2 + 2;
      goto LAB_0012a79e;
    }
    if (ppOVar2[3]->op == OpBeginInvocationInterlockEXT) {
      ppOVar2 = ppOVar2 + 3;
      goto LAB_0012a79e;
    }
    ppOVar2 = ppOVar2 + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 == 1) {
LAB_0012a77f:
    if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
      ppOVar2 = cVar6._M_current;
    }
LAB_0012a79e:
    cVar3._M_current = ppOVar2;
    if (ppOVar2 != cVar6._M_current) {
      while (ppOVar2 = ppOVar2 + 1, ppOVar2 != cVar6._M_current) {
        if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
          *cVar3._M_current = *ppOVar2;
          cVar3._M_current = cVar3._M_current + 1;
        }
      }
      cVar6._M_current =
           (node->ir).operations.
           super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    if (lVar5 == 2) {
LAB_0012a770:
      if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
        ppOVar2 = ppOVar2 + 1;
        goto LAB_0012a77f;
      }
      goto LAB_0012a79e;
    }
    cVar3._M_current = cVar6._M_current;
    if (lVar5 == 3) {
      if ((*ppOVar2)->op != OpBeginInvocationInterlockEXT) {
        ppOVar2 = ppOVar2 + 1;
        goto LAB_0012a770;
      }
      goto LAB_0012a79e;
    }
  }
  std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::erase
            (this,cVar3,cVar6);
  ppOVar2 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppOVar4 = (node->ir).operations.
            super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  cVar6._M_current = ppOVar4;
  if (preserve_last_end) {
    lVar5 = (long)ppOVar4 - (long)ppOVar2 >> 3;
    ppOVar7 = ppOVar4;
    do {
      bVar9 = lVar5 == 0;
      lVar5 = lVar5 + -1;
      cVar6._M_current = ppOVar4;
      if (bVar9) break;
      ppOVar1 = ppOVar7 + -1;
      ppOVar7 = ppOVar7 + -1;
      cVar6._M_current = ppOVar7;
    } while ((*ppOVar1)->op != OpEndInvocationInterlockEXT);
  }
  lVar5 = (long)cVar6._M_current - (long)ppOVar2;
  for (lVar8 = lVar5 >> 5; 0 < lVar8; lVar8 = lVar8 + -1) {
    cVar3._M_current = ppOVar2;
    if ((*ppOVar2)->op == OpEndInvocationInterlockEXT) goto LAB_0012a8b9;
    if (ppOVar2[1]->op == OpEndInvocationInterlockEXT) {
      cVar3._M_current = ppOVar2 + 1;
      goto LAB_0012a8b9;
    }
    if (ppOVar2[2]->op == OpEndInvocationInterlockEXT) {
      cVar3._M_current = ppOVar2 + 2;
      goto LAB_0012a8b9;
    }
    if (ppOVar2[3]->op == OpEndInvocationInterlockEXT) {
      cVar3._M_current = ppOVar2 + 3;
      goto LAB_0012a8b9;
    }
    ppOVar2 = ppOVar2 + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 == 1) {
LAB_0012a89a:
    cVar3._M_current = ppOVar2;
    if ((*ppOVar2)->op != OpEndInvocationInterlockEXT) {
      cVar3._M_current = cVar6._M_current;
    }
  }
  else if (lVar5 == 2) {
LAB_0012a88b:
    cVar3._M_current = ppOVar2;
    if ((*ppOVar2)->op != OpEndInvocationInterlockEXT) {
      ppOVar2 = ppOVar2 + 1;
      goto LAB_0012a89a;
    }
  }
  else {
    cVar3._M_current = cVar6._M_current;
    if (lVar5 != 3) goto LAB_0012a8e9;
    cVar3._M_current = ppOVar2;
    if ((*ppOVar2)->op != OpEndInvocationInterlockEXT) {
      ppOVar2 = ppOVar2 + 1;
      goto LAB_0012a88b;
    }
  }
LAB_0012a8b9:
  ppOVar2 = cVar3._M_current;
  if (cVar3._M_current != cVar6._M_current) {
    while (ppOVar4 = cVar3._M_current + 1, cVar3._M_current = ppOVar2, ppOVar4 != cVar6._M_current)
    {
      cVar3._M_current = ppOVar4;
      if ((*ppOVar4)->op != OpEndInvocationInterlockEXT) {
        *ppOVar2 = *ppOVar4;
        ppOVar2 = ppOVar2 + 1;
      }
    }
  }
LAB_0012a8e9:
  std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>::erase
            (this,cVar3,cVar6);
  return;
}

Assistant:

static void scrub_rov_lock_regions(CFGNode *node, bool preserve_first_begin, bool preserve_last_end)
{
	scrub_rov_begin_lock(node, preserve_first_begin);
	scrub_rov_end_lock(node, preserve_last_end);
}